

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O1

void uo_cb_append_cb(uo_cb *cb,uo_cb *cb_after)

{
  void **__src;
  size_t sVar1;
  uo_linklist *puVar2;
  uo_linklist *puVar3;
  uo_linklist *puVar4;
  void **ppvVar5;
  ulong uVar6;
  ulong uVar7;
  uo_linklist *puVar8;
  long in_FS_OFFSET;
  
  __src = (cb_after->stack).items;
  sVar1 = (cb_after->stack).count;
  uVar7 = (cb->stack).count + sVar1;
  if ((cb->stack).capacity < uVar7) {
    uVar6 = uVar7 - 1 >> 1 | uVar7 - 1;
    uVar6 = uVar6 >> 2 | uVar6;
    uVar6 = uVar6 >> 4 | uVar6;
    uVar6 = uVar6 >> 8 | uVar6;
    uVar6 = uVar6 >> 0x10 | uVar6;
    uVar6 = uVar6 >> 0x20 | uVar6;
    (cb->stack).capacity = uVar6 + 1;
    ppvVar5 = (void **)realloc((cb->stack).items,uVar6 * 8 + 8);
    (cb->stack).items = ppvVar5;
  }
  ppvVar5 = (cb->stack).items;
  memmove(ppvVar5 + sVar1,ppvVar5,(cb->stack).count << 3);
  memcpy((cb->stack).items,__src,sVar1 << 3);
  (cb->stack).count = uVar7;
  puVar8 = (cb_after->funclist).next;
  if (puVar8 != &cb_after->funclist) {
    do {
      puVar2 = puVar8[1].next;
      uo_cb_func_linkpool_grow(0x20);
      puVar3 = *(uo_linklist **)(in_FS_OFFSET + -0x20);
      puVar4 = puVar3->next;
      puVar4->prev = puVar3->prev;
      puVar3->prev->next = puVar4;
      puVar3->next = (uo_linklist *)0x0;
      puVar3->prev = (uo_linklist *)0x0;
      puVar3[1].next = puVar2;
      puVar2 = (cb->funclist).prev;
      puVar3->prev = puVar2;
      puVar2->next = puVar3;
      puVar3->next = &cb->funclist;
      (cb->funclist).prev = puVar3;
      puVar8 = puVar8->next;
    } while (puVar8 != &cb_after->funclist);
  }
  return;
}

Assistant:

void uo_cb_append_cb(
    uo_cb *cb,
    uo_cb *cb_after)
{
    uo_stack_insert_arr(&cb->stack, 0, cb_after->stack.items, cb_after->stack.count);

    uo_linklist *link = cb_after->funclist.next;

    while (link != &cb_after->funclist)
    {
        uo_cb_append_func(cb, ((uo_cb_func_linklist *)link)->item);
        link = link->next;
    }
}